

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

int luaH_psetint(Table *t,lua_Integer key,TValue *val)

{
  int iVar1;
  TValue *slot;
  
  slot = getintfromhash(t,key);
  iVar1 = finishnodeset(t,slot,val);
  return iVar1;
}

Assistant:

int luaH_psetint (Table *t, lua_Integer key, TValue *val) {
  lua_assert(!ikeyinarray(t, key));
  return finishnodeset(t, getintfromhash(t, key), val);
}